

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_thread.h
# Opt level: O2

void DrawerCommandQueue::
     QueueCommand<swrenderer::DrawSingleSky1PalCommand,unsigned_int&,unsigned_int&>
               (uint *args,uint *args_1)

{
  DrawerCommandQueue *this;
  DrawSingleSky1PalCommand *this_00;
  DrawSingleSky1PalCommand command;
  DrawSingleSky1PalCommand local_b8;
  
  this = Instance();
  if ((this->threaded_render == 0) || (r_multithreaded.Value == false)) {
    swrenderer::DrawSingleSky1PalCommand::PalSkyCommand(&local_b8,*args,*args_1);
    VectoredTryCatch(&local_b8,
                     QueueCommand<swrenderer::DrawSingleSky1PalCommand,_unsigned_int_&,_unsigned_int_&>
                     ::anon_class_1_0_00000001::__invoke,
                     QueueCommand<swrenderer::DrawSingleSky1PalCommand,_unsigned_int_&,_unsigned_int_&>
                     ::anon_class_1_0_00000001::__invoke);
  }
  else {
    this_00 = (DrawSingleSky1PalCommand *)AllocMemory(0x98);
    if (this_00 == (DrawSingleSky1PalCommand *)0x0) {
      Finish(this);
      this_00 = (DrawSingleSky1PalCommand *)AllocMemory(0x98);
      if (this_00 == (DrawSingleSky1PalCommand *)0x0) {
        return;
      }
    }
    swrenderer::DrawSingleSky1PalCommand::PalSkyCommand(this_00,*args,*args_1);
    local_b8.super_PalSkyCommand.super_DrawerCommand._vptr_DrawerCommand = (_func_int **)this_00;
    std::vector<DrawerCommand*,std::allocator<DrawerCommand*>>::emplace_back<DrawerCommand*>
              ((vector<DrawerCommand*,std::allocator<DrawerCommand*>> *)&this->commands,
               (DrawerCommand **)&local_b8);
  }
  return;
}

Assistant:

static void QueueCommand(Types &&... args)
	{
		auto queue = Instance();
		if (queue->threaded_render == 0 || !r_multithreaded)
		{
			T command(std::forward<Types>(args)...);
			VectoredTryCatch(&command,
			[](void *data)
			{
				T *c = (T*)data;
				c->Execute(&Instance()->single_core_thread);
			},
			[](void *data, const char *reason, bool fatal)
			{
				T *c = (T*)data;
				ReportDrawerError(c, false, reason, fatal);
			});
		}
		else
		{
			void *ptr = AllocMemory(sizeof(T));
			if (!ptr) // Out of memory - render what we got
			{
				queue->Finish();
				ptr = AllocMemory(sizeof(T));
				if (!ptr)
					return;
			}
			T *command = new (ptr)T(std::forward<Types>(args)...);
			queue->commands.push_back(command);
		}
	}